

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

QTextStream * __thiscall QTextStream::operator>>(QTextStream *this,uint *i)

{
  NumberParsingStatus NVar1;
  QTextStreamPrivate *this_00;
  undefined4 *in_RSI;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *d;
  qulonglong tmp;
  QTextStreamPrivate *in_stack_00000040;
  char *in_stack_ffffffffffffff98;
  Status status;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  QTextStream *local_38;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTextStream *)0x4aaa84);
  if ((this_00->string == (QString *)0x0) && (this_00->device == (QIODevice *)0x0)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)in_RDI,in_stack_ffffffffffffffa4,
               in_stack_ffffffffffffff98);
    QMessageLogger::warning(&local_28,"QTextStream: No device");
    local_38 = in_RDI;
  }
  else {
    NVar1 = QTextStreamPrivate::getNumber(in_stack_00000040,(qulonglong *)tmp);
    status = (Status)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    local_38 = in_RDI;
    if (NVar1 == npsOk) {
      *in_RSI = 0xaaaaaaaa;
    }
    else if (NVar1 - npsMissingDigit < 2) {
      *in_RSI = 0;
      atEnd((QTextStream *)CONCAT44(NVar1,in_stack_ffffffffffffffa0));
      setStatus((QTextStream *)CONCAT44(NVar1,in_stack_ffffffffffffffa0),status);
      local_38 = in_RDI;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_38;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator>>(unsigned int &i)
{
    IMPLEMENT_STREAM_RIGHT_INT_OPERATOR(unsigned int);
}